

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O0

int64_t hdr_interval_recorder_record_corrected_values
                  (hdr_interval_recorder *r,int64_t value,int64_t count,int64_t expected_interval)

{
  int64_t local_48;
  int64_t params [4];
  int64_t expected_interval_local;
  int64_t count_local;
  int64_t value_local;
  hdr_interval_recorder *r_local;
  
  params[2] = 0;
  local_48 = value;
  params[0] = count;
  params[1] = expected_interval;
  params[3] = expected_interval;
  hdr_interval_recorder_update(r,update_corrected_values,&local_48);
  return params[2];
}

Assistant:

int64_t hdr_interval_recorder_record_corrected_values(
    struct hdr_interval_recorder* r,
    int64_t value,
    int64_t count,
    int64_t expected_interval
)
{
    int64_t params[4];
    params[0] = value;
    params[1] = count;
    params[2] = expected_interval;
    params[3] = 0;

    hdr_interval_recorder_update(r, update_corrected_values, &params[0]);
    return params[3];
}